

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m256v_mul(m256v *A,m256v *B,m256v *AB_out)

{
  uint8_t b;
  uint8_t a;
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (0 < AB_out->n_row) {
    lVar2 = 0;
    do {
      if (0 < AB_out->n_col) {
        lVar3 = 0;
        do {
          if (A->n_col < 1) {
            a = '\0';
          }
          else {
            lVar1 = 0;
            a = '\0';
            do {
              b = gf256_mul(A->e[lVar1 + A->rstride * lVar2],B->e[lVar3 + B->rstride * lVar1]);
              a = gf256_add(a,b);
              lVar1 = lVar1 + 1;
            } while (lVar1 < A->n_col);
          }
          AB_out->e[lVar3 + AB_out->rstride * lVar2] = a;
          lVar3 = lVar3 + 1;
        } while (lVar3 < AB_out->n_col);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < AB_out->n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_mul)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* AB_out)
{
	assert(A->n_col == B->n_row);
	assert(A->n_row == AB_out->n_row);
	assert(B->n_col == AB_out->n_col);

	for (int i = 0; i < AB_out->n_row; ++i) {
		for (int j = 0; j < AB_out->n_col; ++j) {
			MV_GEN_ELTYPE x = 0;
			for (int e = 0; e < A->n_col; ++e) {
				const MV_GEN_ELTYPE a = MV_GEN_N(_get_el)(A, i, e);
				const MV_GEN_ELTYPE b = MV_GEN_N(_get_el)(B, e, j);
				x = fadd(x, fmul(a, b));
			}
			MV_GEN_N(_set_el)(AB_out, i, j, x);
		}
	}
}